

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

char * tinyformat::detail::streamStateFromFormat
                 (ostream *out,bool *spacePadPositive,int *ntrunc,char *fmtStart,
                 FormatArg *formatters,int *argIndex,int numFormatters)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  _func_int *p_Var5;
  _func_int **pp_Var6;
  long lVar7;
  byte bVar8;
  bool bVar9;
  byte *local_50;
  FormatArg *local_48;
  int *local_40;
  int *local_38;
  
  local_48 = formatters;
  local_40 = argIndex;
  local_38 = ntrunc;
  if (*fmtStart != '%') {
    __assert_fail("0 && \"tinyformat: Not enough conversion specifiers in format string\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                  ,0x259,
                  "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                 );
  }
  pp_Var6 = out->_vptr_basic_ostream;
  *(undefined8 *)(&out->field_0x10 + (long)pp_Var6[-3]) = 0;
  *(undefined8 *)(&out->field_0x8 + (long)pp_Var6[-3]) = 6;
  p_Var5 = pp_Var6[-3];
  std::ios::fill();
  (&out->field_0xe0)[(long)p_Var5] = 0x20;
  pp_Var6 = out->_vptr_basic_ostream;
  *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) =
       *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) & 0xffffb000;
  lVar7 = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            fmtStart = (char *)((byte *)fmtStart + 1);
            bVar8 = *fmtStart;
            if (bVar8 != 0x2b) break;
            *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) =
                 *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) | 0x800;
            *spacePadPositive = false;
            lVar7 = 1;
          }
          if (bVar8 != 0x20) break;
          if (((&out->field_0x19)[(long)pp_Var6[-3]] & 8) == 0) {
            *spacePadPositive = true;
          }
        }
        local_50 = (byte *)fmtStart;
        if (bVar8 != 0x30) break;
        p_Var5 = pp_Var6[-3];
        if (((&out->field_0x18)[(long)p_Var5] & 0x20) == 0) {
          std::ios::fill();
          (&out->field_0xe0)[(long)p_Var5] = 0x30;
          pp_Var6 = out->_vptr_basic_ostream;
          *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) =
               *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) & 0xffffff4f | 0x10;
        }
      }
      if (bVar8 != 0x2d) break;
      p_Var5 = pp_Var6[-3];
      std::ios::fill();
      (&out->field_0xe0)[(long)p_Var5] = 0x20;
      pp_Var6 = out->_vptr_basic_ostream;
      *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) =
           *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) & 0xffffff4f | 0x20;
    }
    if (bVar8 != 0x23) break;
    *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) | 0x600;
  }
  bVar9 = (byte)(bVar8 - 0x30) < 10;
  if (bVar9) {
    p_Var5 = pp_Var6[-3];
    iVar3 = parseIntAndAdvance((char **)&local_50);
    *(long *)(&out->field_0x10 + (long)p_Var5) = (long)iVar3;
    bVar8 = *local_50;
  }
  if (bVar8 == 0x2a) {
    iVar3 = *local_40;
    if (numFormatters <= iVar3) {
      __assert_fail("0 && \"tinyformat: Not enough arguments to read variable width\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                    ,0x29a,
                    "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                   );
    }
    *local_40 = iVar3 + 1;
    uVar4 = FormatArg::toInt(local_48 + iVar3);
    pp_Var6 = out->_vptr_basic_ostream;
    if ((int)uVar4 < 0) {
      p_Var5 = pp_Var6[-3];
      std::ios::fill();
      (&out->field_0xe0)[(long)p_Var5] = 0x20;
      pp_Var6 = out->_vptr_basic_ostream;
      *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) =
           *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) & 0xffffff4f | 0x20;
      uVar4 = -uVar4;
    }
    *(ulong *)(&out->field_0x10 + (long)pp_Var6[-3]) = (ulong)uVar4;
    bVar8 = local_50[1];
    bVar9 = true;
    local_50 = local_50 + 1;
  }
  if (bVar8 == 0x2e) {
    bVar1 = local_50[1];
    if (bVar1 == 0x2a) {
      local_50 = local_50 + 2;
      iVar3 = *local_40;
      if (numFormatters <= iVar3) {
        __assert_fail("0 && \"tinyformat: Not enough arguments to read variable precision\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                      ,0x2b0,
                      "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                     );
      }
      *local_40 = iVar3 + 1;
      iVar3 = FormatArg::toInt(local_48 + iVar3);
      pbVar2 = local_50;
    }
    else if ((byte)(bVar1 - 0x30) < 10) {
      local_50 = local_50 + 1;
      iVar3 = parseIntAndAdvance((char **)&local_50);
      pbVar2 = local_50;
    }
    else {
      iVar3 = 0;
      pbVar2 = local_50 + 1;
      if (bVar1 == 0x2d) {
        local_50 = local_50 + 2;
        parseIntAndAdvance((char **)&local_50);
        pbVar2 = local_50;
      }
    }
    local_50 = pbVar2;
    *(long *)(&out->field_0x8 + (long)out->_vptr_basic_ostream[-3]) = (long)iVar3;
  }
LAB_0012317b:
  bVar1 = *local_50;
  switch(bVar1) {
  case 0x45:
    pp_Var6 = out->_vptr_basic_ostream;
    *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) | 0x4000;
LAB_00123215:
    *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) & 0xfffffefb | 0x100;
    p_Var5 = pp_Var6[-3];
    uVar4 = *(uint *)(&out->field_0x18 + (long)p_Var5) & 0xffffffb5 | 2;
LAB_00123298:
    *(uint *)(&out->field_0x18 + (long)p_Var5) = uVar4;
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 99:
  case 0x6b:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x76:
  case 0x77:
  case 0x79:
switchD_00123192_caseD_48:
    return (char *)(local_50 + 1);
  case 0x46:
    pp_Var6 = out->_vptr_basic_ostream;
    *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) | 0x4000;
    goto LAB_00123288;
  case 0x47:
    pp_Var6 = out->_vptr_basic_ostream;
    *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) | 0x4000;
    goto LAB_0012323f;
  case 0x4c:
  case 0x68:
  case 0x6a:
  case 0x6c:
  case 0x74:
  case 0x7a:
    goto switchD_00123192_caseD_4c;
  case 0x58:
    pp_Var6 = out->_vptr_basic_ostream;
    *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) | 0x4000;
    goto LAB_001231d5;
  case 0x61:
    goto switchD_00123192_caseD_61;
  case 100:
  case 0x69:
  case 0x75:
    pp_Var6 = out->_vptr_basic_ostream;
    uVar4 = 2;
    break;
  case 0x65:
    pp_Var6 = out->_vptr_basic_ostream;
    goto LAB_00123215;
  case 0x66:
    pp_Var6 = out->_vptr_basic_ostream;
LAB_00123288:
    p_Var5 = pp_Var6[-3];
    uVar4 = *(uint *)(&out->field_0x18 + (long)p_Var5) & 0xfffffefb | 4;
    goto LAB_00123298;
  case 0x67:
    pp_Var6 = out->_vptr_basic_ostream;
LAB_0012323f:
    *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) & 0xffffffb5 | 2;
    *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) & 0xfffffefb;
    goto switchD_00123192_caseD_48;
  case 0x6e:
    __assert_fail("0 && \"tinyformat: %n conversion spec not supported\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                  ,0x2f9,
                  "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                 );
  case 0x6f:
    pp_Var6 = out->_vptr_basic_ostream;
    uVar4 = 0x40;
    break;
  case 0x70:
  case 0x78:
    pp_Var6 = out->_vptr_basic_ostream;
LAB_001231d5:
    uVar4 = 8;
    break;
  case 0x73:
    pp_Var6 = out->_vptr_basic_ostream;
    if (bVar8 == 0x2e) {
      *local_38 = *(int *)(&out->field_0x8 + (long)pp_Var6[-3]);
    }
    *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) | 1;
    goto switchD_00123192_caseD_48;
  default:
    if (bVar1 == 0) {
      __assert_fail("0 && \"tinyformat: Conversion spec incorrectly \" \"terminated by end of string\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                    ,0x2fd,
                    "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                   );
    }
    if (bVar1 == 0x41) {
switchD_00123192_caseD_61:
      __assert_fail("0 && \"tinyformat: the %a and %A conversion specs \" \"are not supported\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                    ,0x2ec,
                    "const char *tinyformat::detail::streamStateFromFormat(std::ostream &, bool &, int &, const char *, const detail::FormatArg *, int &, int)"
                   );
    }
    goto switchD_00123192_caseD_48;
  }
  *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) =
       *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) & 0xffffffb5 | uVar4;
  if (!(bool)(bVar9 | bVar8 != 0x2e)) {
    *(long *)(&out->field_0x10 + (long)pp_Var6[-3]) =
         lVar7 + *(long *)(&out->field_0x8 + (long)pp_Var6[-3]);
    *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) =
         *(uint *)(&out->field_0x18 + (long)pp_Var6[-3]) & 0xffffff4f | 0x10;
    p_Var5 = pp_Var6[-3];
    std::ios::fill();
    (&out->field_0xe0)[(long)p_Var5] = 0x30;
  }
  goto switchD_00123192_caseD_48;
switchD_00123192_caseD_4c:
  local_50 = local_50 + 1;
  goto LAB_0012317b;
}

Assistant:

inline const char* streamStateFromFormat(std::ostream& out, bool& spacePadPositive,
                                         int& ntrunc, const char* fmtStart,
                                         const detail::FormatArg* formatters,
                                         int& argIndex, int numFormatters)
{
    if(*fmtStart != '%')
    {
        TINYFORMAT_ERROR("tinyformat: Not enough conversion specifiers in format string");
        return fmtStart;
    }
    // Reset stream state to defaults.
    out.width(0);
    out.precision(6);
    out.fill(' ');
    // Reset most flags; ignore irrelevant unitbuf & skipws.
    out.unsetf(std::ios::adjustfield | std::ios::basefield |
               std::ios::floatfield | std::ios::showbase | std::ios::boolalpha |
               std::ios::showpoint | std::ios::showpos | std::ios::uppercase);
    bool precisionSet = false;
    bool widthSet = false;
    int widthExtra = 0;
    const char* c = fmtStart + 1;
    // 1) Parse flags
    for(;; ++c)
    {
        switch(*c)
        {
            case '#':
                out.setf(std::ios::showpoint | std::ios::showbase);
                continue;
            case '0':
                // overridden by left alignment ('-' flag)
                if(!(out.flags() & std::ios::left))
                {
                    // Use internal padding so that numeric values are
                    // formatted correctly, eg -00010 rather than 000-10
                    out.fill('0');
                    out.setf(std::ios::internal, std::ios::adjustfield);
                }
                continue;
            case '-':
                out.fill(' ');
                out.setf(std::ios::left, std::ios::adjustfield);
                continue;
            case ' ':
                // overridden by show positive sign, '+' flag.
                if(!(out.flags() & std::ios::showpos))
                    spacePadPositive = true;
                continue;
            case '+':
                out.setf(std::ios::showpos);
                spacePadPositive = false;
                widthExtra = 1;
                continue;
            default:
                break;
        }
        break;
    }
    // 2) Parse width
    if(*c >= '0' && *c <= '9')
    {
        widthSet = true;
        out.width(parseIntAndAdvance(c));
    }
    if(*c == '*')
    {
        widthSet = true;
        int width = 0;
        if(argIndex < numFormatters)
            width = formatters[argIndex++].toInt();
        else
            TINYFORMAT_ERROR("tinyformat: Not enough arguments to read variable width");
        if(width < 0)
        {
            // negative widths correspond to '-' flag set
            out.fill(' ');
            out.setf(std::ios::left, std::ios::adjustfield);
            width = -width;
        }
        out.width(width);
        ++c;
    }
    // 3) Parse precision
    if(*c == '.')
    {
        ++c;
        int precision = 0;
        if(*c == '*')
        {
            ++c;
            if(argIndex < numFormatters)
                precision = formatters[argIndex++].toInt();
            else
                TINYFORMAT_ERROR("tinyformat: Not enough arguments to read variable precision");
        }
        else
        {
            if(*c >= '0' && *c <= '9')
                precision = parseIntAndAdvance(c);
            else if(*c == '-') // negative precisions ignored, treated as zero.
                parseIntAndAdvance(++c);
        }
        out.precision(precision);
        precisionSet = true;
    }
    // 4) Ignore any C99 length modifier
    while(*c == 'l' || *c == 'h' || *c == 'L' ||
          *c == 'j' || *c == 'z' || *c == 't')
        ++c;
    // 5) We're up to the conversion specifier character.
    // Set stream flags based on conversion specifier (thanks to the
    // boost::format class for forging the way here).
    bool intConversion = false;
    switch(*c)
    {
        case 'u': case 'd': case 'i':
            out.setf(std::ios::dec, std::ios::basefield);
            intConversion = true;
            break;
        case 'o':
            out.setf(std::ios::oct, std::ios::basefield);
            intConversion = true;
            break;
        case 'X':
            out.setf(std::ios::uppercase);
            [[fallthrough]]; // Falls through
        case 'x': case 'p':
            out.setf(std::ios::hex, std::ios::basefield);
            intConversion = true;
            break;
        case 'E':
            out.setf(std::ios::uppercase);
            [[fallthrough]]; // Falls through
        case 'e':
            out.setf(std::ios::scientific, std::ios::floatfield);
            out.setf(std::ios::dec, std::ios::basefield);
            break;
        case 'F':
            out.setf(std::ios::uppercase);
            [[fallthrough]]; // Falls through
        case 'f':
            out.setf(std::ios::fixed, std::ios::floatfield);
            break;
        case 'G':
            out.setf(std::ios::uppercase);
            [[fallthrough]]; // Falls through
        case 'g':
            out.setf(std::ios::dec, std::ios::basefield);
            // As in boost::format, let stream decide float format.
            out.flags(out.flags() & ~std::ios::floatfield);
            break;
        case 'a': case 'A':
            TINYFORMAT_ERROR("tinyformat: the %a and %A conversion specs "
                             "are not supported");
            break;
        case 'c':
            // Handled as special case inside formatValue()
            break;
        case 's':
            if(precisionSet)
                ntrunc = static_cast<int>(out.precision());
            // Make %s print booleans as "true" and "false"
            out.setf(std::ios::boolalpha);
            break;
        case 'n':
            // Not supported - will cause problems!
            TINYFORMAT_ERROR("tinyformat: %n conversion spec not supported");
            break;
        case '\0':
            TINYFORMAT_ERROR("tinyformat: Conversion spec incorrectly "
                             "terminated by end of string");
            return c;
        default:
            break;
    }
    if(intConversion && precisionSet && !widthSet)
    {
        // "precision" for integers gives the minimum number of digits (to be
        // padded with zeros on the left).  This isn't really supported by the
        // iostreams, but we can approximately simulate it with the width if
        // the width isn't otherwise used.
        out.width(out.precision() + widthExtra);
        out.setf(std::ios::internal, std::ios::adjustfield);
        out.fill('0');
    }
    return c+1;
}